

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_24f1a::
ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  thread *this_00;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_01;
  long lVar1;
  undefined1 auStack_98 [8];
  array<std::thread,_8UL> threads;
  _func_void_tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_ptr_unsigned_long_unsigned_long
  *local_50;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_48;
  unsigned_long local_40;
  ulong local_38;
  
  this_01 = &(this->
             super_ARTConcurrencyTest<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ).verifier;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_key_range_internal(this_01,0,3,true);
  local_50 = ARTConcurrencyTest<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ::key_range_op_thread;
  threads._M_elems[3]._M_id._M_thread = (id)0;
  threads._M_elems[4]._M_id._M_thread = (id)0;
  threads._M_elems[5]._M_id._M_thread = (id)0;
  threads._M_elems[6]._M_id._M_thread = (id)0;
  auStack_98 = (undefined1  [8])0x0;
  threads._M_elems[0]._M_id._M_thread = (id)0;
  threads._M_elems[1]._M_id._M_thread = (id)0;
  threads._M_elems[2]._M_id._M_thread = (id)0;
  this_00 = threads._M_elems + 7;
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    local_40 = 6;
    local_48 = this_01;
    std::thread::
    thread<void(*&)(unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long,unsigned_long),unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long&,unsigned_long,void>
              (this_00,&local_50,&local_48,&local_38,&local_40);
    std::thread::operator=(threads._M_elems + (local_38 - 1),this_00);
    std::thread::~thread(this_00);
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
    std::thread::join();
  }
  std::array<std::thread,_8UL>::~array((array<std::thread,_8UL> *)auStack_98);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest, Node4ParallelOps) {
  this->template key_range_op_test<3, 8, 6>();
}